

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O2

string * qpBasisStatusToString_abi_cxx11_
                   (string *__return_storage_ptr__,BasisStatus qp_basis_status)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(qp_basis_status) {
  case kInactive:
    pcVar2 = "Inactive";
    paVar1 = &local_9;
    break;
  case kActiveAtLower:
    pcVar2 = "Active at lower bound";
    paVar1 = &local_a;
    break;
  case kActiveAtUpper:
    pcVar2 = "Active at upper bound";
    paVar1 = &local_b;
    break;
  case kInactiveInBasis:
    pcVar2 = "Inactive in basis";
    paVar1 = &local_c;
    break;
  default:
    pcVar2 = "Unidentified QP basis status";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string qpBasisStatusToString(const BasisStatus qp_basis_status) {
  switch (qp_basis_status) {
    case BasisStatus::kInactive:
      return "Inactive";
    case BasisStatus::kActiveAtLower:
      return "Active at lower bound";
    case BasisStatus::kActiveAtUpper:
      return "Active at upper bound";
    case BasisStatus::kInactiveInBasis:
      return "Inactive in basis";
    default:
      return "Unidentified QP basis status";
  }
}